

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O2

void __thiscall
YAJLScan::YAJLScan(YAJLScan *this,YAJLMiscData *misc,YAJLFrameHeader *fheader,bitio_stream *bstream)

{
  byte bVar1;
  pointer pYVar2;
  u16 marker;
  ssize_t sVar3;
  pointer __nbytes;
  uint uVar4;
  int iVar5;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *__buf_00;
  ulong uVar6;
  uint uVar7;
  int i;
  ulong uVar8;
  int iVar9;
  bool bVar10;
  float fVar11;
  bitio_stream *bstream_local;
  float local_94;
  YAJLScanHeader *local_90;
  int local_84;
  vector<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_> *local_80;
  vector<YAJLScan::MCU,std::allocator<YAJLScan::MCU>> *local_78;
  YAJLFrameHeader *local_70;
  ulong local_68;
  pointer local_60;
  YAJLScanHeader local_58;
  
  bstream_local = bstream;
  YAJLTables::YAJLTables(&this->tables);
  local_90 = &this->header;
  local_80 = &(this->header).specs;
  (this->header).specs.super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->header).specs.super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->header).specs.super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mcus).super__Vector_base<YAJLScan::MCU,_std::allocator<YAJLScan::MCU>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78 = (vector<YAJLScan::MCU,std::allocator<YAJLScan::MCU>> *)&this->mcus;
  (this->mcus).super__Vector_base<YAJLScan::MCU,_std::allocator<YAJLScan::MCU>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mcus).super__Vector_base<YAJLScan::MCU,_std::allocator<YAJLScan::MCU>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __buf = extraout_RDX;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          sVar3 = bitio::bitio_stream::read(bstream_local,0x10,__buf,(size_t)bstream);
          uVar4 = (uint)sVar3;
          bstream = (bitio_stream *)(ulong)(uVar4 & 0xfff0);
          if ((short)(uVar4 & 0xfff0) != -0x20) break;
          YAJLMiscData::fetch_app_data(misc,bstream_local);
          __buf = extraout_RDX_00;
        }
        marker = (u16)sVar3;
        if (marker != 0xffdb) break;
        YAJLTables::fetch_qtable(&this->tables,bstream_local);
        __buf = extraout_RDX_02;
      }
      if ((uVar4 & 0xffff) != 0xfffe) break;
      YAJLMiscData::fetch_comment(misc,bstream_local);
      __buf = extraout_RDX_01;
    }
    bstream = (bitio_stream *)(ulong)(uVar4 & 0xfff7);
    if ((uVar4 & 0xfff7) != 0xffc4) break;
    YAJLTables::fetch_etable(&this->tables,marker,bstream_local);
    __buf = extraout_RDX_03;
  }
  if (marker == 0xffda) {
    YAJLScanHeader::YAJLScanHeader(&local_58,bstream_local);
    YAJLScanHeader::operator=(local_90,&local_58);
    std::_Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>::~_Vector_base
              (&local_58.specs.
                super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>);
    pYVar2 = (fheader->specs).
             super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = 0;
    __nbytes = pYVar2;
    while( true ) {
      uVar7 = uVar4 & 0xff;
      if (__nbytes ==
          (fheader->specs).
          super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>._M_impl.
          super__Vector_impl_data._M_finish) break;
      uVar4 = (uint)__nbytes->vertical_sampling_factor * (uint)__nbytes->horizontal_sampling_factor;
      if (uVar4 <= uVar7) {
        uVar4 = uVar7;
      }
      __nbytes = __nbytes + 1;
    }
    local_94 = (float)(uVar7 << 6);
    bVar1 = local_90->ncomponents;
    uVar6 = 0;
    for (uVar8 = 0; bVar1 != uVar8; uVar8 = uVar8 + 1) {
      uVar4 = (uint)pYVar2[uVar8].vertical_sampling_factor *
              (uint)pYVar2[uVar8].horizontal_sampling_factor;
      __nbytes = (pointer)(ulong)uVar4;
      fVar11 = ceilf(((float)uVar4 *
                     (float)(int)((uint)fheader->nsamples_per_line * (uint)fheader->nlines)) /
                     local_94);
      uVar6 = (ulong)((float)(uVar6 & 0xffffffff) + fVar11);
    }
    iVar5 = 0;
    fVar11 = 0.0;
    local_70 = fheader;
    local_68 = uVar6;
    while ((uint)fVar11 < (uint)(float)local_68) {
      uVar6 = (ulong)(local_80->
                     super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>).
                     _M_impl.super__Vector_impl_data._M_start[iVar5].component_selector;
      pYVar2 = (local_70->specs).
               super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>._M_impl
               .super__Vector_impl_data._M_start;
      iVar9 = (uint)pYVar2[uVar6 - 1].vertical_sampling_factor *
              (uint)pYVar2[uVar6 - 1].horizontal_sampling_factor;
      local_94 = (float)((int)fVar11 + iVar9);
      local_84 = iVar5;
      while (bVar10 = iVar9 != 0, iVar9 = iVar9 + -1, bVar10) {
        local_60 = (this->header).specs.
                   super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>.
                   _M_impl.super__Vector_impl_data._M_start + (uVar6 - 1);
        local_58._0_8_ = this;
        std::vector<YAJLScan::MCU,std::allocator<YAJLScan::MCU>>::
        emplace_back<bitio::bitio_stream*&,YAJLTables*,YAJLScanHeaderSpec*>
                  (local_78,&bstream_local,(YAJLTables **)&local_58,&local_60);
      }
      __nbytes = (pointer)(ulong)local_90->ncomponents;
      iVar5 = (local_84 + 1) % (int)(uint)local_90->ncomponents;
      fVar11 = local_94;
    }
    bitio::bitio_stream::force_align(bstream_local);
    sVar3 = bitio::bitio_stream::read(bstream_local,0x10,__buf_00,(size_t)__nbytes);
    printf("%x\n",sVar3);
    printf("Run completed at: %s for \'Scan\'\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/supercmmetry[P]yajl/src/frame.cpp"
          );
    return;
  }
  fprintf(_stderr,"Unhandled marker at: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/supercmmetry[P]yajl/src/frame.cpp"
         );
  exit(1);
}

Assistant:

YAJLScan::YAJLScan(YAJLMiscData *misc, YAJLFrameHeader *fheader, bitio::bitio_stream *bstream) {
    // we fill YAJLScan with data fetch directly over bitio streams.
    bool run = true;
    while (run) {
        u16 marker = bstream->read(0x10);
        // since we are inside a Scan, we don't need to handle SOF markers
        if (markers::is_app_marker(marker)) {
            misc->fetch_app_data(bstream);
        } else if (marker == markers::COM) {
            misc->fetch_comment(bstream);
        } else if (marker == markers::DQT) {
            tables.fetch_qtable(bstream);
        } else if (marker == markers::DHT || marker == markers::DAC) {
            tables.fetch_etable(marker, bstream);
        } else if (marker == markers::SOS) {
            header = YAJLScanHeader(bstream);
            // scan for MCUs here
            // if Ns > 1, then the MCUs are interleaved. refer B.2.3 from ISO 10918
            // the interleaved components are ordered in this fashion: Cs1, Cs2 ... Csj

            int index = 0;
            u32 mcu_count = 0;
            u32 mcu_max_count = 0;
            u8 max_sampling_factor = 0;
            for (auto spec : fheader->specs) {
                auto sfactor = spec.horizontal_sampling_factor * spec.vertical_sampling_factor;
                if (max_sampling_factor < sfactor) {
                    max_sampling_factor = sfactor;
                }
            }

            for (int i = 0; i < header.ncomponents; i++) {
                auto sampling_factor = fheader->specs[i].horizontal_sampling_factor * fheader->specs[i].vertical_sampling_factor;
                mcu_max_count += ceil((float) (fheader->nlines * fheader->nsamples_per_line) * sampling_factor / (64 * max_sampling_factor));
            }

            while (mcu_count < mcu_max_count) {

                auto cmp_id = header.specs[index].component_selector - 1;
                auto fspec = fheader->specs[cmp_id];
                for (int r = 0; r < fspec.vertical_sampling_factor * fspec.horizontal_sampling_factor; r++) {
                    mcus.emplace_back(bstream, &tables, &header.specs[cmp_id]);
                    mcu_count++;
                }
                index = (index + 1) % header.ncomponents;
            }

            bstream->force_align();
            printf("%x\n", bstream->read(0x10));

#ifdef DEBUG
            printf("Run completed at: %s for 'Scan'\n", __FILE__);
#endif
            run = false;
        } else {
            fprintf(stderr, "Unhandled marker at: %s\n", __FILE__);
            exit(1);
        }
    }
}